

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Vec_t * Aig_ManLevelize(Aig_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *p_00;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  void *Entry;
  uint uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  uint uVar7;
  ulong local_48;
  
  uVar1 = Aig_ManLevelNum(p);
  uVar7 = uVar1 + 1;
  local_48 = (ulong)uVar7;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  uVar4 = 8;
  if (8 < uVar7) {
    uVar4 = uVar7;
  }
  p_00->nCap = uVar4;
  ppvVar2 = (void **)malloc((ulong)(uVar4 << 3));
  p_00->pArray = ppvVar2;
  for (uVar5 = 0; local_48 != uVar5; uVar5 = uVar5 + 1) {
    pVVar3 = Vec_PtrAlloc(0);
    ppvVar2[uVar5] = pVVar3;
  }
  p_00->nSize = uVar7;
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      return (Vec_Vec_t *)p_00;
    }
    Entry = Vec_PtrEntry(p->vObjs,i);
    if (Entry != (void *)0x0) {
      uVar4 = (uint)((ulong)*(undefined8 *)((long)Entry + 0x18) >> 0x20);
      uVar7 = uVar4 & 0xffffff;
      if (uVar1 < uVar7) {
        __assert_fail("(int)pObj->Level <= nLevels",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                      ,0x13c,"Vec_Vec_t *Aig_ManLevelize(Aig_Man_t *)");
      }
      if ((int)uVar7 < (int)local_48) {
        uVar5 = (ulong)(uVar4 & 0xffffff);
      }
      else {
        uVar7 = uVar7 + 1;
        Vec_PtrGrow(p_00,uVar7);
        uVar5 = (ulong)(uVar4 & 0xffffff);
        for (lVar6 = (long)p_00->nSize; lVar6 <= (long)uVar5; lVar6 = lVar6 + 1) {
          pVVar3 = Vec_PtrAlloc(0);
          p_00->pArray[lVar6] = pVVar3;
        }
        p_00->nSize = uVar7;
        ppvVar2 = p_00->pArray;
        local_48 = (ulong)uVar7;
      }
      Vec_PtrPush((Vec_Ptr_t *)ppvVar2[uVar5],Entry);
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Aig_ManLevelize( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Aig_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Aig_ManForEachObj( p, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}